

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O2

IVec3 __thiscall
deqp::gles31::Functional::anon_unknown_1::getIVec3
          (anon_unknown_1 *this,Functions *gl,deUint32 pname)

{
  GLenum err;
  int extraout_EDX;
  anon_unknown_1 *paVar1;
  int ndx;
  long lVar2;
  IVec3 IVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  code *local_38;
  deUint32 local_30;
  
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)this,-1);
  paVar1 = this;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    (*gl->getIntegeri_v)(pname,(GLuint)lVar2,(GLint *)paVar1);
    paVar1 = paVar1 + 4;
  }
  err = (*gl->getError)();
  local_38 = glu::getGettableStateName;
  local_30 = pname;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_58,&local_38);
  std::operator+(&bStack_98,"glGetIntegeri_v(",&local_58);
  std::operator+(&local_78,&bStack_98,")");
  glu::checkError(err,local_78._M_dataplus._M_p,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderBuiltinConstantTests.cpp"
                  ,0x51);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_58);
  IVar3.m_data[2] = extraout_EDX;
  IVar3.m_data._0_8_ = this;
  return (IVec3)IVar3.m_data;
}

Assistant:

static tcu::IVec3 getIVec3 (const glw::Functions& gl, deUint32 pname)
{
	tcu::IVec3 value(-1);
	for (int ndx = 0; ndx < 3; ndx++)
		gl.getIntegeri_v(pname, (glw::GLuint)ndx, &value[ndx]);
	GLU_EXPECT_NO_ERROR(gl.getError(), ("glGetIntegeri_v(" + glu::getGettableStateStr((int)pname).toString() + ")").c_str());
	return value;
}